

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O1

bool __thiscall CETestSuite::test(CETestSuite *this,bool test_success,string *function,int *line)

{
  undefined7 in_register_00000031;
  char *__format;
  undefined1 local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_49 = test_success;
  local_48[0] = local_38;
  if ((int)CONCAT71(in_register_00000031,test_success) == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Generic test FAILED.","");
    printf("- Fnc: %s, ln %d\n",(function->_M_dataplus)._M_p,(ulong)(uint)*line);
    __format = "  [ ] %s\n";
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Generic test SUCCEEDED.","")
    ;
    printf("- Fnc: %s, ln %d\n",(function->_M_dataplus)._M_p,(ulong)(uint)*line);
    __format = "  [x] %s\n";
  }
  printf(__format,local_48[0]);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  (*this->_vptr_CETestSuite[0xf])(this,&local_49);
  return (bool)local_49;
}

Assistant:

bool CETestSuite::test(bool  test_success, 
                       const std::string& function,
                       const int&         line)
{
    // Values equal within tolerance
    if (test_success) {
        log_success("Generic test SUCCEEDED.", function, line);
    } 
    // Values not within tolerance
    else {
        log_failure("Generic test FAILED.", function, line);
    }

    update_pass(test_success);
    return test_success;
}